

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_md.c
# Opt level: O0

EVP_MD * GOST_init_digest(GOST_digest *d)

{
  char *name;
  int iVar1;
  char *data;
  long *in_RDI;
  EVP_MD *md;
  long local_f0;
  long local_e8;
  long local_d8;
  long local_d0;
  long local_c0;
  long local_b8;
  long local_a8;
  long local_a0;
  long local_90;
  long local_88;
  long local_78;
  long local_70;
  uint local_5c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_28;
  undefined4 local_24;
  EVP_MD *local_18;
  
  if (in_RDI[3] != 0) {
    return (EVP_MD *)in_RDI[3];
  }
  local_18 = (EVP_MD *)EVP_MD_meth_new((int)in_RDI[1],0);
  if (local_18 != (EVP_MD *)0x0) {
    if ((int)in_RDI[4] == 0) {
      if (*in_RDI == 0) {
        local_28 = 0;
      }
      else {
        local_28 = *(undefined4 *)(*in_RDI + 0x20);
      }
      local_24 = local_28;
    }
    else {
      local_24 = (undefined4)in_RDI[4];
    }
    iVar1 = EVP_MD_meth_set_result_size(local_18,local_24);
    if (iVar1 != 0) {
      if (*(int *)((long)in_RDI + 0x24) == 0) {
        if (*in_RDI == 0) {
          local_38 = 0;
        }
        else {
          local_38 = *(undefined4 *)(*in_RDI + 0x24);
        }
        local_34 = local_38;
      }
      else {
        local_34 = *(undefined4 *)((long)in_RDI + 0x24);
      }
      iVar1 = EVP_MD_meth_set_input_blocksize(local_18,local_34);
      if (iVar1 != 0) {
        if ((int)in_RDI[5] == 0) {
          if (*in_RDI == 0) {
            local_48 = 0;
          }
          else {
            local_48 = *(undefined4 *)(*in_RDI + 0x28);
          }
          local_44 = local_48;
        }
        else {
          local_44 = (undefined4)in_RDI[5];
        }
        iVar1 = EVP_MD_meth_set_app_datasize(local_18,local_44);
        if (iVar1 != 0) {
          if (*in_RDI == 0) {
            local_5c = 0;
          }
          else {
            local_5c = *(uint *)(*in_RDI + 0x2c);
          }
          iVar1 = EVP_MD_meth_set_flags
                            (local_18,(long)(int)(*(uint *)((long)in_RDI + 0x2c) | local_5c));
          if (iVar1 != 0) {
            if (in_RDI[6] == 0) {
              if (*in_RDI == 0) {
                local_78 = 0;
              }
              else {
                local_78 = *(long *)(*in_RDI + 0x30);
              }
              local_70 = local_78;
            }
            else {
              local_70 = in_RDI[6];
            }
            iVar1 = EVP_MD_meth_set_init(local_18,local_70);
            if (iVar1 != 0) {
              if (in_RDI[7] == 0) {
                if (*in_RDI == 0) {
                  local_90 = 0;
                }
                else {
                  local_90 = *(long *)(*in_RDI + 0x38);
                }
                local_88 = local_90;
              }
              else {
                local_88 = in_RDI[7];
              }
              iVar1 = EVP_MD_meth_set_update(local_18,local_88);
              if (iVar1 != 0) {
                if (in_RDI[8] == 0) {
                  if (*in_RDI == 0) {
                    local_a8 = 0;
                  }
                  else {
                    local_a8 = *(long *)(*in_RDI + 0x40);
                  }
                  local_a0 = local_a8;
                }
                else {
                  local_a0 = in_RDI[8];
                }
                iVar1 = EVP_MD_meth_set_final(local_18,local_a0);
                if (iVar1 != 0) {
                  if (in_RDI[9] == 0) {
                    if (*in_RDI == 0) {
                      local_c0 = 0;
                    }
                    else {
                      local_c0 = *(long *)(*in_RDI + 0x48);
                    }
                    local_b8 = local_c0;
                  }
                  else {
                    local_b8 = in_RDI[9];
                  }
                  iVar1 = EVP_MD_meth_set_copy(local_18,local_b8);
                  if (iVar1 != 0) {
                    if (in_RDI[10] == 0) {
                      if (*in_RDI == 0) {
                        local_d8 = 0;
                      }
                      else {
                        local_d8 = *(long *)(*in_RDI + 0x50);
                      }
                      local_d0 = local_d8;
                    }
                    else {
                      local_d0 = in_RDI[10];
                    }
                    iVar1 = EVP_MD_meth_set_cleanup(local_18,local_d0);
                    if (iVar1 != 0) {
                      if (in_RDI[0xb] == 0) {
                        if (*in_RDI == 0) {
                          local_f0 = 0;
                        }
                        else {
                          local_f0 = *(long *)(*in_RDI + 0x58);
                        }
                        local_e8 = local_f0;
                      }
                      else {
                        local_e8 = in_RDI[0xb];
                      }
                      iVar1 = EVP_MD_meth_set_ctrl(local_18,local_e8);
                      if (iVar1 != 0) goto LAB_0011e71a;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  EVP_MD_meth_free(local_18);
  local_18 = (EVP_MD *)0x0;
LAB_0011e71a:
  if ((local_18 != (EVP_MD *)0x0) && (in_RDI[2] != 0)) {
    name = (char *)in_RDI[2];
    data = (char *)EVP_MD_get0_name(local_18);
    OBJ_NAME_add(name,0x8001,data);
  }
  in_RDI[3] = (long)local_18;
  return local_18;
}

Assistant:

EVP_MD *GOST_init_digest(GOST_digest *d)
{
    if (d->digest)
        return d->digest;

    EVP_MD *md;
    if (!(md = EVP_MD_meth_new(d->nid, NID_undef))
        || !EVP_MD_meth_set_result_size(md, TPL(d, result_size))
        || !EVP_MD_meth_set_input_blocksize(md, TPL(d, input_blocksize))
        || !EVP_MD_meth_set_app_datasize(md, TPL(d, app_datasize))
        || !EVP_MD_meth_set_flags(md, d->flags | TPL_VAL(d, flags))
        || !EVP_MD_meth_set_init(md, TPL(d, init))
        || !EVP_MD_meth_set_update(md, TPL(d, update))
        || !EVP_MD_meth_set_final(md, TPL(d, final))
        || !EVP_MD_meth_set_copy(md, TPL(d, copy))
        || !EVP_MD_meth_set_cleanup(md, TPL(d, cleanup))
        || !EVP_MD_meth_set_ctrl(md, TPL(d, ctrl))) {
        EVP_MD_meth_free(md);
        md = NULL;
    }
    if (md && d->alias)
        EVP_add_digest_alias(EVP_MD_name(md), d->alias);
    d->digest = md;
    return md;
}